

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O2

void g_canvas_newpdinstance(void)

{
  _instancecanvas *p_Var1;
  
  p_Var1 = (_instancecanvas *)getbytes(0x48);
  pd_maininstance.pd_gui = p_Var1;
  p_Var1->i_newdirectory = &s_;
  p_Var1->i_newfilename = &s_;
  p_Var1->i_newargc = 0;
  p_Var1->i_dspstate = 0;
  p_Var1->i_dollarzero = 1000;
  p_Var1->i_newargv = (t_atom *)0x0;
  p_Var1->i_reloadingabstraction = (_glist *)0x0;
  g_editor_newpdinstance();
  g_template_newpdinstance();
  return;
}

Assistant:

void g_canvas_newpdinstance(void)
{
    THISGUI = getbytes(sizeof(*THISGUI));
    THISGUI->i_newfilename = THISGUI->i_newdirectory = &s_;
    THISGUI->i_newargc = 0;
    THISGUI->i_newargv = 0;
    THISGUI->i_reloadingabstraction = 0;
    THISGUI->i_dspstate = 0;
    THISGUI->i_dollarzero = 1000;
    g_editor_newpdinstance();
    g_template_newpdinstance();
}